

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows_h.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  allocator local_7f2;
  allocator local_7f1;
  undefined1 local_7f0 [40];
  string local_7c8;
  undefined1 local_7a8 [40];
  EitherFlag local_780;
  CompletionFlag completion;
  HelpFlag help;
  ArgumentParser parser;
  
  std::__cxx11::string::string
            ((string *)&completion,"This is a test program.",(allocator *)local_7a8);
  std::__cxx11::string::string
            ((string *)&help,"This goes after the options.",(allocator *)local_7f0);
  args::ArgumentParser::ArgumentParser(&parser,(string *)&completion,(string *)&help);
  std::__cxx11::string::~string((string *)&help);
  std::__cxx11::string::~string((string *)&completion);
  std::__cxx11::string::string((string *)local_7f0,"help",&local_7f1);
  std::__cxx11::string::string((string *)&local_7c8,"Display this help menu",&local_7f2);
  local_7a8._8_8_ = local_7a8 + 0x18;
  local_7a8[0] = true;
  local_7a8[1] = 'h';
  local_7a8._16_8_ = (_Hash_node_base *)0x0;
  local_7a8[0x18] = '\0';
  args::EitherFlag::EitherFlag(&local_780,"help");
  in._M_len = 2;
  in._M_array = (iterator)local_7a8;
  args::Matcher::Matcher((Matcher *)&completion,in);
  args::HelpFlag::HelpFlag
            (&help,(Group *)&parser,(string *)local_7f0,&local_7c8,(Matcher *)&completion,None);
  args::Matcher::~Matcher((Matcher *)&completion);
  lVar1 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(local_7a8 + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)local_7f0);
  args::EitherFlag::EitherFlag((EitherFlag *)local_7f0,"complete");
  in_00._M_len = 1;
  in_00._M_array = (iterator)local_7f0;
  args::Matcher::Matcher((Matcher *)local_7a8,in_00);
  args::CompletionFlag::CompletionFlag<args::ArgumentParser>
            (&completion,&parser,(Matcher *)local_7a8);
  args::Matcher::~Matcher((Matcher *)local_7a8);
  std::__cxx11::string::~string((string *)(local_7f0 + 8));
  args::ArgumentParser::ParseCLI(&parser,argc,argv);
  args::CompletionFlag::~CompletionFlag(&completion);
  args::FlagBase::~FlagBase((FlagBase *)&help);
  args::ArgumentParser::~ArgumentParser(&parser);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    args::ArgumentParser parser("This is a test program.", "This goes after the options.");
    args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
    args::CompletionFlag completion(parser, {"complete"});
    try
    {
        parser.ParseCLI(argc, argv);
    }
    catch (args::Completion& e)
    {
        std::cout << e.what();
        return 0;
    }
    catch (args::Help&)
    {
        std::cout << parser;
        return 0;
    }
    catch (args::ParseError& e)
    {
        std::cerr << e.what() << std::endl;
        std::cerr << parser;
        return 1;
    }
    return 0;
}